

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

void __thiscall
duckdb::AddColumnInfo::AddColumnInfo
          (AddColumnInfo *this,AlterEntryData *data,ColumnDefinition *new_column,
          bool if_column_not_exists)

{
  AlterEntryData AStack_88;
  
  AlterEntryData::AlterEntryData(&AStack_88,data);
  AlterTableInfo::AlterTableInfo(&this->super_AlterTableInfo,ADD_COLUMN,&AStack_88);
  AlterEntryData::~AlterEntryData(&AStack_88);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__AddColumnInfo_02792488;
  ColumnDefinition::ColumnDefinition(&this->new_column,new_column);
  this->if_column_not_exists = if_column_not_exists;
  return;
}

Assistant:

AddColumnInfo::AddColumnInfo(AlterEntryData data, ColumnDefinition new_column, bool if_column_not_exists)
    : AlterTableInfo(AlterTableType::ADD_COLUMN, std::move(data)), new_column(std::move(new_column)),
      if_column_not_exists(if_column_not_exists) {
}